

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<LibrarySearchPath>::copyAppend
          (QGenericArrayOps<LibrarySearchPath> *this,LibrarySearchPath *b,LibrarySearchPath *e)

{
  qsizetype *pqVar1;
  LibrarySearchPath *pLVar2;
  long lVar3;
  Data *pDVar4;
  
  if ((b != e) && (b < e)) {
    pLVar2 = (this->super_QArrayDataPointer<LibrarySearchPath>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<LibrarySearchPath>).size;
      pDVar4 = (b->super_QMakeLocalFileName).real_name.d.d;
      pLVar2[lVar3].super_QMakeLocalFileName.real_name.d.d = pDVar4;
      pLVar2[lVar3].super_QMakeLocalFileName.real_name.d.ptr =
           (b->super_QMakeLocalFileName).real_name.d.ptr;
      pLVar2[lVar3].super_QMakeLocalFileName.real_name.d.size =
           (b->super_QMakeLocalFileName).real_name.d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar4->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pDVar4 = (b->super_QMakeLocalFileName).local_name.d.d;
      pLVar2[lVar3].super_QMakeLocalFileName.local_name.d.d = pDVar4;
      pLVar2[lVar3].super_QMakeLocalFileName.local_name.d.ptr =
           (b->super_QMakeLocalFileName).local_name.d.ptr;
      pLVar2[lVar3].super_QMakeLocalFileName.local_name.d.size =
           (b->super_QMakeLocalFileName).local_name.d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pLVar2[lVar3]._default = b->_default;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<LibrarySearchPath>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }